

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# seriot_suite.cpp
# Opt level: O2

void i_number_suite::i_number_pos_double_huge_exp(void)

{
  size_t sVar1;
  char *self;
  unkbyte10 in_ST0;
  view_type local_188;
  longdouble local_178;
  char input [10];
  reader reader;
  
  builtin_strncpy(input,"1.5e+9999",10);
  sVar1 = strlen(input);
  local_188._M_len._0_4_ = (value)sVar1;
  local_188._M_len._4_4_ = (undefined4)(sVar1 >> 0x20);
  local_188._M_str._0_2_ = SUB82(input,0);
  local_188._M_str._2_6_ = (undefined6)((ulong)input >> 0x10);
  trial::protocol::json::basic_reader<char>::basic_reader(&reader,&local_188);
  local_188._M_len._0_4_ = reader.decoder.current.code;
  local_178 = (longdouble)CONCAT64(local_178._4_6_,9);
  boost::detail::
  test_with_impl<boost::detail::lw_test_eq,trial::protocol::json::token::code::value,trial::protocol::json::token::code::value>
            ("reader.code()","token::code::real",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/json/seriot_suite.cpp"
             ,0x41,"void i_number_suite::i_number_pos_double_huge_exp()",&local_188,&local_178);
  local_188._M_len = (long)reader.decoder.current.view.tail - (long)reader.decoder.current.view.head
  ;
  local_188._M_str._0_2_ = SUB82(reader.decoder.current.view.head,0);
  local_188._M_str._2_6_ = (undefined6)((ulong)reader.decoder.current.view.head >> 0x10);
  self = "\"1.5e+9999\"";
  boost::detail::
  test_with_impl<boost::detail::lw_test_eq,std::basic_string_view<char,std::char_traits<char>>,char[10]>
            ("reader.literal()","\"1.5e+9999\"",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/json/seriot_suite.cpp"
             ,0x42,"void i_number_suite::i_number_pos_double_huge_exp()",&local_188,"1.5e+9999");
  trial::protocol::json::basic_reader<char>::overloader<long_double,_void>::value
            ((longdouble *)&reader,(basic_reader<char> *)self);
  local_188._M_len._0_4_ = (value)in_ST0;
  local_188._M_len._4_4_ = (undefined4)((unkuint10)in_ST0 >> 0x20);
  local_188._M_str._0_2_ = (undefined2)((unkuint10)in_ST0 >> 0x40);
  local_178 = (longdouble)INFINITY;
  boost::detail::test_with_impl<boost::detail::lw_test_eq,long_double,long_double>
            ("reader.value<long double>()","std::numeric_limits<long double>::infinity()",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/json/seriot_suite.cpp"
             ,0x44,"void i_number_suite::i_number_pos_double_huge_exp()",&local_188,&local_178);
  std::
  _Vector_base<trial::protocol::json::basic_reader<char>::frame,_std::allocator<trial::protocol::json::basic_reader<char>::frame>_>
  ::~_Vector_base((_Vector_base<trial::protocol::json::basic_reader<char>::frame,_std::allocator<trial::protocol::json::basic_reader<char>::frame>_>
                   *)&reader.stack);
  return;
}

Assistant:

void i_number_pos_double_huge_exp()
{
    const char input[] = "1.5e+9999";
    json::reader reader(input);
    TRIAL_PROTOCOL_TEST_EQUAL(reader.code(), token::code::real);
    TRIAL_PROTOCOL_TEST_EQUAL(reader.literal(), "1.5e+9999");
    // Cannot be represented by long double
    TRIAL_PROTOCOL_TEST_EQUAL(reader.value<long double>(), std::numeric_limits<long double>::infinity());
}